

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O3

UBool __thiscall
icu_63::FCDUTF16CollationIterator::operator==
          (FCDUTF16CollationIterator *this,CollationIterator *other)

{
  UChar *pUVar1;
  UChar *pUVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  UBool UVar5;
  
  UVar5 = CollationIterator::operator==((CollationIterator *)this,other);
  if ((UVar5 != '\0') && (this->checkDir == (char)other[1].ceBuffer.buffer.stackArray[10])) {
    if (this->checkDir != '\0') {
LAB_0021efbc:
      return (long)(this->super_UTF16CollationIterator).pos - (long)this->rawStart ==
             (long)other[1].trie - *(long *)&other[1].ceBuffer;
    }
    pUVar1 = (this->super_UTF16CollationIterator).start;
    pUVar2 = this->segmentStart;
    pp_Var3 = other[1].super_UObject._vptr_UObject;
    pp_Var4 = (_func_int **)other[1].ceBuffer.buffer.ptr;
    if ((pUVar1 == pUVar2) != (pp_Var3 != pp_Var4)) {
      if (pUVar1 == pUVar2) goto LAB_0021efbc;
      if ((long)pUVar2 - (long)this->rawStart == (long)pp_Var4 - *(long *)&other[1].ceBuffer) {
        return (long)(this->super_UTF16CollationIterator).pos - (long)pUVar1 ==
               (long)other[1].trie - (long)pp_Var3;
      }
    }
  }
  return '\0';
}

Assistant:

UBool
FCDUTF16CollationIterator::operator==(const CollationIterator &other) const {
    // Skip the UTF16CollationIterator and call its parent.
    if(!CollationIterator::operator==(other)) { return FALSE; }
    const FCDUTF16CollationIterator &o = static_cast<const FCDUTF16CollationIterator &>(other);
    // Compare the iterator state but not the text: Assume that the caller does that.
    if(checkDir != o.checkDir) { return FALSE; }
    if(checkDir == 0 && (start == segmentStart) != (o.start == o.segmentStart)) { return FALSE; }
    if(checkDir != 0 || start == segmentStart) {
        return (pos - rawStart) == (o.pos - o.rawStart);
    } else {
        return (segmentStart - rawStart) == (o.segmentStart - o.rawStart) &&
                (pos - start) == (o.pos - o.start);
    }
}